

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac.c
# Opt level: O1

void rekey(uint8_t *key,uint8_t *new_key,uint key_size)

{
  ulong uVar1;
  
  if (key_size == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      key[uVar1] = new_key[uVar1] ^ 0x36;
      key[uVar1 + 0x40] = new_key[uVar1] ^ 0x5c;
      uVar1 = uVar1 + 1;
    } while (key_size != uVar1);
  }
  if ((uint)uVar1 < 0x40) {
    uVar1 = uVar1 & 0xffffffff;
    do {
      key[uVar1] = '6';
      key[uVar1 + 0x40] = '\\';
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x40);
  }
  return;
}

Assistant:

static void rekey(uint8_t *key, const uint8_t *new_key, unsigned int key_size)
{
	const uint8_t inner_pad = (uint8_t) 0x36;
	const uint8_t outer_pad = (uint8_t) 0x5c;
	unsigned int i;

	for (i = 0; i < key_size; ++i) {
		key[i] = inner_pad ^ new_key[i];
		key[i + TC_SHA256_BLOCK_SIZE] = outer_pad ^ new_key[i];
	}
	for (; i < TC_SHA256_BLOCK_SIZE; ++i) {
		key[i] = inner_pad; key[i + TC_SHA256_BLOCK_SIZE] = outer_pad;
	}
}